

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall cpp_db::transaction::transaction(transaction *this,connection *conn)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *this_00;
  unique_ptr<cpp_db::transaction_interface,_std::default_delete<cpp_db::transaction_interface>_>
  local_20;
  connection *local_18;
  connection *conn_local;
  transaction *this_local;
  
  local_18 = conn;
  conn_local = (connection *)this;
  std::weak_ptr<cpp_db::connection_interface>::weak_ptr<cpp_db::connection_interface,void>
            (&this->conn_impl,&conn->conn_impl);
  peVar2 = std::
           __shared_ptr_access<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_18);
  (*peVar2->_vptr_driver_interface[6])(&local_20,peVar2,&local_18->conn_impl);
  std::shared_ptr<cpp_db::transaction_interface>::
  shared_ptr<cpp_db::transaction_interface,std::default_delete<cpp_db::transaction_interface>,void>
            (&this->trans_impl,&local_20);
  std::
  unique_ptr<cpp_db::transaction_interface,_std::default_delete<cpp_db::transaction_interface>_>::
  ~unique_ptr(&local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->trans_impl);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"No transaction object from driver!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

transaction::transaction(const connection &conn)
    : conn_impl(conn.conn_impl)
    , trans_impl(conn.driver_impl->make_transaction(conn.conn_impl))
{
	if (!trans_impl)
		throw std::runtime_error("No transaction object from driver!");
}